

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getpart.c
# Opt level: O1

int appenddata(char **dst_buf,size_t *dst_len,size_t *dst_alloc,char *src_buf,int src_b64)

{
  size_t sVar1;
  uchar *puVar2;
  CURLcode CVar3;
  char *pcVar4;
  bool bVar5;
  ulong uVar6;
  size_t src_len;
  anon_union_8_2_5fd17a9a buf64;
  size_t local_40;
  uchar *local_38;
  
  local_40 = strlen(src_buf);
  if (local_40 == 0) {
    return 0;
  }
  local_38 = (uchar *)0x0;
  if (src_b64 == 0) goto LAB_001044f3;
  CVar3 = Curl_base64_decode(src_buf,&local_38,&local_40);
  puVar2 = local_38;
  if (CVar3 == CURLE_OK) {
    if (local_38 != (uchar *)0x0 && local_40 == 0) {
      (*Curl_cfree)(local_38);
      src_buf = (char *)puVar2;
      goto LAB_001044e4;
    }
    bVar5 = local_40 != 0 && local_38 != (uchar *)0x0;
    src_buf = (char *)local_38;
  }
  else {
LAB_001044e4:
    bVar5 = false;
  }
  if (!bVar5) {
    return -1;
  }
LAB_001044f3:
  uVar6 = local_40 + *dst_len + 1;
  if (*dst_alloc < uVar6) {
    sVar1 = uVar6 * 2;
    pcVar4 = (char *)(*Curl_crealloc)(*dst_buf,sVar1);
    if (pcVar4 == (char *)0x0) {
      if (local_38 != (uchar *)0x0) {
        (*Curl_cfree)(local_38);
      }
    }
    else {
      *dst_alloc = sVar1;
      *dst_buf = pcVar4;
    }
    if (pcVar4 == (char *)0x0) {
      return -1;
    }
  }
  memcpy(*dst_buf + *dst_len,src_buf,local_40);
  sVar1 = *dst_len;
  *dst_len = sVar1 + local_40;
  (*dst_buf)[sVar1 + local_40] = '\0';
  if (local_38 != (uchar *)0x0) {
    (*Curl_cfree)(local_38);
  }
  return 0;
}

Assistant:

static int appenddata(char  **dst_buf,   /* dest buffer */
                      size_t *dst_len,   /* dest buffer data length */
                      size_t *dst_alloc, /* dest buffer allocated size */
                      char   *src_buf,   /* source buffer */
                      int     src_b64)   /* != 0 if source is base64 encoded */
{
  size_t need_alloc, src_len;
  union {
    unsigned char *as_uchar;
             char *as_char;
  } buf64;

  src_len = strlen(src_buf);
  if(!src_len)
    return GPE_OK;

  buf64.as_char = NULL;

  if(src_b64) {
    /* base64 decode the given buffer */
    int error = (int) Curl_base64_decode(src_buf, &buf64.as_uchar, &src_len);
    if(error)
      return GPE_OUT_OF_MEMORY;
    src_buf = buf64.as_char;
    if(!src_len || !src_buf) {
      /*
      ** currently there is no way to tell apart an OOM condition in
      ** Curl_base64_decode() from zero length decoded data. For now,
      ** let's just assume it is an OOM condition, currently we have
      ** no input for this function that decodes to zero length data.
      */
      if(buf64.as_char)
        free(buf64.as_char);
      return GPE_OUT_OF_MEMORY;
    }
  }

  need_alloc = src_len + *dst_len + 1;

  /* enlarge destination buffer if required */
  if(need_alloc > *dst_alloc) {
    size_t newsize = need_alloc * 2;
    char *newptr = realloc(*dst_buf, newsize);
    if(!newptr) {
      if(buf64.as_char)
        free(buf64.as_char);
      return GPE_OUT_OF_MEMORY;
    }
    *dst_alloc = newsize;
    *dst_buf = newptr;
  }

  /* memcpy to support binary blobs */
  memcpy(*dst_buf + *dst_len, src_buf, src_len);
  *dst_len += src_len;
  *(*dst_buf + *dst_len) = '\0';

  if(buf64.as_char)
    free(buf64.as_char);

  return GPE_OK;
}